

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O0

status asio::detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform
                 (reactor_op *base)

{
  bool bVar1;
  long in_RDI;
  error_code *unaff_retaddr;
  bool in_stack_0000000b;
  int in_stack_0000000c;
  size_t in_stack_00000010;
  void *in_stack_00000018;
  socket_type in_stack_00000020;
  size_t *in_stack_00000030;
  status result;
  reactive_socket_recv_op_base<asio::mutable_buffers_1> *o;
  mutable_buffer local_38;
  mutable_buffer local_28;
  status local_14;
  long local_10;
  
  local_10 = in_RDI;
  local_28 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first
                       ((mutable_buffers_1 *)(in_RDI + 0x48));
  mutable_buffer::data((mutable_buffer *)&local_28);
  local_38 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first
                       ((mutable_buffers_1 *)(local_10 + 0x48));
  mutable_buffer::size((mutable_buffer *)&local_38);
  bVar1 = socket_ops::non_blocking_recv1
                    (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                     in_stack_0000000b,unaff_retaddr,in_stack_00000030);
  local_14 = (status)bVar1;
  if (((local_14 == done) && ((*(byte *)(local_10 + 0x44) & 0x10) != 0)) &&
     (*(long *)(local_10 + 0x30) == 0)) {
    local_14 = done_and_exhausted;
  }
  return local_14;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    ASIO_ASSUME(base != 0);
    reactive_socket_recv_op_base* o(
        static_cast<reactive_socket_recv_op_base*>(base));

    typedef buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs_type;

    status result;
    if (bufs_type::is_single_buffer)
    {
      result = socket_ops::non_blocking_recv1(o->socket_,
          bufs_type::first(o->buffers_).data(),
          bufs_type::first(o->buffers_).size(), o->flags_,
          (o->state_ & socket_ops::stream_oriented) != 0,
          o->ec_, o->bytes_transferred_) ? done : not_done;
    }
    else
    {
      bufs_type bufs(o->buffers_);
      result = socket_ops::non_blocking_recv(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          (o->state_ & socket_ops::stream_oriented) != 0,
          o->ec_, o->bytes_transferred_) ? done : not_done;
    }

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ == 0)
          result = done_and_exhausted;

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recv",
          o->ec_, o->bytes_transferred_));

    return result;
  }